

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O2

void api_fixed_suite::fixed_front_const(void)

{
  const_reference piVar1;
  undefined4 local_2c;
  array<int,_4UL> array;
  circular_view<int,_4UL> span;
  
  span.member.data = array._M_elems;
  array._M_elems[0] = 0xb;
  array._M_elems[1] = 0x16;
  array._M_elems[2] = 0x21;
  array._M_elems[3] = 0x2c;
  span.member.size = 4;
  span.member.next = 4;
  piVar1 = vista::circular_view<int,_4UL>::front(&span);
  local_2c = 0xb;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","11",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x368,"void api_fixed_suite::fixed_front_const()",piVar1,&local_2c);
  return;
}

Assistant:

void fixed_front_const()
{
    std::array<int, 4> array = {11, 22, 33, 44};
    const circular_view<int, 4> span(array.begin(), array.end(), array.begin(), array.size());
    BOOST_TEST_EQ(span.front(), 11);
}